

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::Constraint::isFeasiblePoint
          (Constraint *this,double time,VectorDynSize *state,VectorDynSize *control)

{
  VectorDynSize *this_00;
  double dVar1;
  int iVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((this->m_isUpperBounded != false) || (bVar6 = true, this->m_isLowerBounded == true)) {
    this_00 = &this->m_valueBuffer;
    iVar2 = (*this->_vptr_Constraint[3])(this,state,control,this_00);
    if ((char)iVar2 == '\0') {
      iDynTree::reportError("Constraint","isFeasiblePoint","Failed to evaluate constraint.");
    }
    bVar6 = this->m_constraintSize == 0;
    if (!bVar6) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        if (this->m_isLowerBounded == true) {
          pdVar3 = (double *)iDynTree::VectorDynSize::operator()(this_00,uVar5);
          dVar1 = *pdVar3;
          pdVar3 = (double *)iDynTree::VectorDynSize::operator()(&this->m_lowerBound,uVar5);
          if (dVar1 < *pdVar3) {
            return bVar6;
          }
        }
        if (this->m_isUpperBounded == true) {
          pdVar3 = (double *)iDynTree::VectorDynSize::operator()(this_00,uVar5);
          dVar1 = *pdVar3;
          pdVar3 = (double *)iDynTree::VectorDynSize::operator()(&this->m_upperBound,uVar5);
          if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
            return bVar6;
          }
        }
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        bVar6 = this->m_constraintSize <= uVar5;
      } while (uVar5 < this->m_constraintSize);
    }
  }
  return bVar6;
}

Assistant:

bool Constraint::isFeasiblePoint(double time, const VectorDynSize &state, const VectorDynSize &control)
        {
            if (!m_isUpperBounded && !m_isLowerBounded) {
                return true;
            }

            if (!evaluateConstraint(time, state, control, m_valueBuffer)){
                reportError("Constraint", "isFeasiblePoint", "Failed to evaluate constraint.");
                assert(false);
            }

            for (unsigned int i = 0; i < constraintSize(); ++i){
                if (m_isLowerBounded) {
                    if (m_valueBuffer(i) < m_lowerBound(i)) {
                        return false;
                    }
                }

                if (m_isUpperBounded) {
                    if (m_valueBuffer(i) > m_upperBound(i)) {
                        return false;
                    }
                }
            }
            return true;
        }